

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O1

int xmlModuleClose(xmlModulePtr module)

{
  int iVar1;
  int iVar2;
  
  if (module != (xmlModulePtr)0x0) {
    iVar1 = dlclose(module->handle);
    iVar2 = -2;
    if (iVar1 == 0) {
      (*xmlFree)(module->name);
      (*xmlFree)(module);
      iVar2 = 0;
    }
    return iVar2;
  }
  return -1;
}

Assistant:

int
xmlModuleClose(xmlModulePtr module)
{
    int rc;

    if (NULL == module)
        return -1;

    rc = xmlModulePlatformClose(module->handle);

    if (rc != 0)
        return -2;

    rc = xmlModuleFree(module);
    return (rc);
}